

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPM_CC_Array_Unmarshal(TPM_CC *target,BYTE **buffer,INT32 *size,INT32 count)

{
  int iVar1;
  UINT32 UVar2;
  ulong uVar3;
  
  if (count < 1) {
    return 0;
  }
  uVar3 = 0;
  do {
    iVar1 = *size;
    *size = iVar1 + -4;
    if (iVar1 < 4) {
      return 0x9a;
    }
    UVar2 = ByteArrayToUint32(*buffer);
    target[uVar3] = UVar2;
    *buffer = *buffer + 4;
    uVar3 = uVar3 + 1;
  } while ((uint)count != uVar3);
  return 0;
}

Assistant:

TPM_RC
TPM_CC_Array_Unmarshal(TPM_CC *target, BYTE **buffer, INT32 *size, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPM_CC_Unmarshal(&target[i], buffer, size);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}